

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_util.c
# Opt level: O0

void archive_set_error(archive *a,int error_number,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  __va_list_tag *in_stack_000000a0;
  char *in_stack_000000a8;
  va_list ap;
  undefined1 auStack_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_28 = auStack_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  *(undefined4 *)(in_RDI + 0x34) = in_ESI;
  if (in_RDX == 0) {
    *(undefined8 *)(in_RDI + 0x38) = 0;
  }
  else {
    *(undefined8 *)(in_RDI + 0x48) = 0;
    local_30 = &stack0x00000008;
    local_34 = 0x30;
    local_38 = 0x18;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    local_18 = in_RDX;
    local_c = in_ESI;
    local_8 = in_RDI;
    archive_string_vsprintf((archive_string *)ap[0]._0_8_,in_stack_000000a8,in_stack_000000a0);
    *(undefined8 *)(local_8 + 0x38) = *(undefined8 *)(local_8 + 0x40);
  }
  return;
}

Assistant:

void
archive_set_error(struct archive *a, int error_number, const char *fmt, ...)
{
	va_list ap;

	a->archive_error_number = error_number;
	if (fmt == NULL) {
		a->error = NULL;
		return;
	}

	archive_string_empty(&(a->error_string));
	va_start(ap, fmt);
	archive_string_vsprintf(&(a->error_string), fmt, ap);
	va_end(ap);
	a->error = a->error_string.s;
}